

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_start_map(Parser *this,bool as_child)

{
  uint uVar1;
  ulong uVar2;
  Tree *pTVar3;
  size_t sVar4;
  State *pSVar5;
  Tree *this_00;
  code *pcVar6;
  Location LVar7;
  undefined1 auVar8 [24];
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  NodeData *pNVar13;
  size_t *psVar14;
  size_t ichild;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  NodeData *pNVar18;
  NodeType_e NVar19;
  byte bVar20;
  csubstr cVar21;
  csubstr tag;
  char msg [58];
  char local_128 [24];
  char *pcStack_110;
  undefined8 local_108;
  undefined2 uStack_100;
  undefined6 uStack_fe;
  undefined2 uStack_f8;
  char acStack_f6 [22];
  undefined4 local_e0;
  undefined1 local_dc;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar20 = 0;
  this->m_state->flags = this->m_state->flags & 0xffffff39U | 0x84;
  if ((this->m_stack).m_size == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '_';
    local_128[9] = '\\';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    pcStack_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108._0_1_ = 'e';
    local_108._1_1_ = '\0';
    local_108._2_1_ = '\0';
    local_108._3_1_ = '\0';
    local_108._4_1_ = '\0';
    local_108._5_1_ = '\0';
    local_108._6_1_ = '\0';
    local_108._7_1_ = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  uVar2 = ((this->m_stack).m_stack)->node_id;
  if (uVar2 == 0xffffffffffffffff) {
    pNVar18 = (NodeData *)0x0;
  }
  else {
    pTVar3 = this->m_tree;
    if (pTVar3->m_cap <= uVar2) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar18 = pTVar3->m_buf + uVar2;
  }
  uVar2 = this->m_root_id;
  if (uVar2 == 0xffffffffffffffff) {
    pNVar13 = (NodeData *)0x0;
  }
  else {
    pTVar3 = this->m_tree;
    if (pTVar3->m_cap <= uVar2) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar13 = pTVar3->m_buf + uVar2;
  }
  if (pNVar18 != pNVar13) {
    uStack_f8 = 0x6f72;
    builtin_strncpy(acStack_f6,"ot_id))",8);
    local_108._0_1_ = 'o';
    local_108._1_1_ = 'm';
    local_108._2_1_ = '(';
    local_108._3_1_ = ')';
    local_108._4_1_ = ')';
    local_108._5_1_ = ' ';
    local_108._6_1_ = '=';
    local_108._7_1_ = '=';
    uStack_100 = 0x6e20;
    uStack_fe = 0x5f6d2865646f;
    builtin_strncpy(local_128 + 0x10,"ode(m_st",8);
    pcStack_110 = (char *)0x74746f622e6b6361;
    builtin_strncpy(local_128,"check failed: (n",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    local_58 = 0;
    uStack_50 = 0x780f;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar8 = ZEXT1224(ZEXT412(0x780f) << 0x40);
    LVar7.name.str._0_4_ = 0x1fdf9a;
    LVar7.super_LineCol.offset = auVar8._0_8_;
    LVar7.super_LineCol.line = auVar8._8_8_;
    LVar7.super_LineCol.col = auVar8._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x3a,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar2 = (this->m_stack).m_size;
  psVar14 = &(this->m_stack).m_stack[uVar2 - 2].node_id;
  if (uVar2 < 2) {
    psVar14 = &this->m_root_id;
  }
  sVar4 = *psVar14;
  if (sVar4 == 0xffffffffffffffff) {
    builtin_strncpy(local_128 + 0x10,"arent_id",8);
    pcStack_110 = (char *)0x454e4f4e203d2120;
    builtin_strncpy(local_128,"check failed: (p",0x10);
    local_108._0_2_ = 0x29;
    if ((s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    local_80 = 0;
    uStack_78 = 0x7811;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar8 = ZEXT1224(ZEXT412(0x7811) << 0x40);
    LVar9.name.str._0_4_ = 0x1fdf9a;
    LVar9.super_LineCol.offset = auVar8._0_8_;
    LVar9.super_LineCol.line = auVar8._8_8_;
    LVar9.super_LineCol.col = auVar8._16_8_;
    LVar9.name.str._4_4_ = 0;
    LVar9.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x22,LVar9,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar2 = this->m_state->node_id;
  if (uVar2 != 0xffffffffffffffff) {
    pTVar3 = this->m_tree;
    if (pTVar3->m_cap <= uVar2) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar3->m_buf != (NodeData *)0x0) {
      uVar2 = this->m_state->node_id;
      if (uVar2 == 0xffffffffffffffff) {
        pNVar18 = (NodeData *)0x0;
      }
      else {
        pTVar3 = this->m_tree;
        if (pTVar3->m_cap <= uVar2) {
          if ((s_error_flags & 1) != 0) {
            bVar12 = is_debugger_attached();
            if (bVar12) {
              pcVar6 = (code *)swi(3);
              (*pcVar6)();
              return;
            }
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          pcStack_110 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_108._0_1_ = 'e';
          local_108._1_1_ = '\0';
          local_108._2_1_ = '\0';
          local_108._3_1_ = '\0';
          local_108._4_1_ = '\0';
          local_108._5_1_ = '\0';
          local_108._6_1_ = '\0';
          local_108._7_1_ = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar18 = pTVar3->m_buf + uVar2;
      }
      uVar2 = this->m_root_id;
      if (uVar2 == 0xffffffffffffffff) {
        pNVar13 = (NodeData *)0x0;
      }
      else {
        pTVar3 = this->m_tree;
        if (pTVar3->m_cap <= uVar2) {
          if ((s_error_flags & 1) != 0) {
            bVar12 = is_debugger_attached();
            if (bVar12) {
              pcVar6 = (code *)swi(3);
              (*pcVar6)();
              return;
            }
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          pcStack_110 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_108._0_1_ = 'e';
          local_108._1_1_ = '\0';
          local_108._2_1_ = '\0';
          local_108._3_1_ = '\0';
          local_108._4_1_ = '\0';
          local_108._5_1_ = '\0';
          local_108._6_1_ = '\0';
          local_108._7_1_ = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar13 = pTVar3->m_buf + uVar2;
      }
      if (pNVar18 != pNVar13) {
        pcVar16 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
        pcVar17 = local_128;
        for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar16;
          pcVar16 = pcVar16 + ((ulong)bVar20 * -2 + 1) * 8;
          pcVar17 = pcVar17 + ((ulong)bVar20 * -2 + 1) * 8;
        }
        local_dc = 0;
        local_e0 = 0x29296469;
        if ((s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        local_a8 = 0;
        uStack_a0 = 0x7812;
        local_98 = 0;
        pcStack_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_88 = 0x65;
        auVar8 = ZEXT1224(ZEXT412(0x7812) << 0x40);
        LVar10.name.str._0_4_ = 0x1fdf9a;
        LVar10.super_LineCol.offset = auVar8._0_8_;
        LVar10.super_LineCol.line = auVar8._8_8_;
        LVar10.super_LineCol.col = auVar8._16_8_;
        LVar10.name.str._4_4_ = 0;
        LVar10.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_128,0x4d,LVar10,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  if (as_child) {
    pTVar3 = this->m_tree;
    if ((sVar4 == 0xffffffffffffffff) || (pTVar3->m_cap <= sVar4)) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7d;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar2 = pTVar3->m_buf[sVar4].m_last_child;
    if (sVar4 == 0xffffffffffffffff) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x4f;
      local_128[9] = 'L';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    if ((sVar4 == 0xffffffffffffffff) || (pTVar3->m_cap <= sVar4)) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar3->m_buf[sVar4].m_type.type & (STREAM|MAP)) == NOTYPE) {
      bVar12 = Tree::is_root(pTVar3,sVar4);
      if (!bVar12) {
        if ((s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x4e;
        local_128[9] = 'L';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108._0_1_ = 'e';
        local_108._1_1_ = '\0';
        local_108._2_1_ = '\0';
        local_108._3_1_ = '\0';
        local_108._4_1_ = '\0';
        local_108._5_1_ = '\0';
        local_108._6_1_ = '\0';
        local_108._7_1_ = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    if (uVar2 != 0xffffffffffffffff) {
      if (pTVar3->m_cap <= uVar2) {
        if ((s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x7d;
        local_128[9] = 'K';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108._0_1_ = 'e';
        local_108._1_1_ = '\0';
        local_108._2_1_ = '\0';
        local_108._3_1_ = '\0';
        local_108._4_1_ = '\0';
        local_108._5_1_ = '\0';
        local_108._6_1_ = '\0';
        local_108._7_1_ = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (pTVar3->m_buf[uVar2].m_parent != sVar4) {
        if ((s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x4d;
        local_128[9] = 'L';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108._0_1_ = 'e';
        local_108._1_1_ = '\0';
        local_108._2_1_ = '\0';
        local_108._3_1_ = '\0';
        local_108._4_1_ = '\0';
        local_108._5_1_ = '\0';
        local_108._6_1_ = '\0';
        local_108._7_1_ = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    ichild = Tree::_claim(pTVar3);
    Tree::_set_hierarchy(pTVar3,ichild,sVar4,uVar2);
    pSVar5 = this->m_state;
    pSVar5->node_id = ichild;
    uVar1 = pSVar5->flags;
    if ((uVar1 >> 9 & 1) == 0) {
      Tree::to_map(this->m_tree,ichild,0);
    }
    else {
      cVar21 = _consume_scalar(this);
      Tree::to_map(this->m_tree,this->m_state->node_id,cVar21,(ulong)((uVar1 & 0x400) << 3));
      _write_key_anchor(this,this->m_state->node_id);
      pcVar16 = (this->m_key_tag).str;
      if (pcVar16 != (char *)0x0 && (this->m_key_tag).len != 0) {
        pTVar3 = this->m_tree;
        sVar4 = this->m_state->node_id;
        cVar21.len = (this->m_key_tag).len;
        cVar21.str = pcVar16;
        cVar21 = normalize_tag(cVar21);
        Tree::set_key_tag(pTVar3,sVar4,cVar21);
        (this->m_key_tag).str = (char *)0x0;
        (this->m_key_tag).len = 0;
      }
    }
    uVar2 = this->m_state->node_id;
    pcVar16 = (this->m_state->line_contents).rem.str;
    pTVar3 = this->m_tree;
    if ((uVar2 == 0xffffffffffffffff) || (pTVar3->m_cap <= uVar2)) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7d;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pTVar3->m_buf[uVar2].m_val.scalar.str = pcVar16;
    _write_val_anchor(this,this->m_state->node_id);
  }
  else {
    if (sVar4 == 0xffffffffffffffff) {
      builtin_strncpy(local_128 + 0x10,"arent_id",8);
      pcStack_110 = (char *)0x454e4f4e203d2120;
      builtin_strncpy(local_128,"check failed: (p",0x10);
      local_108._0_2_ = 0x29;
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_d0 = 0;
      uStack_c8 = 0x7830;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      auVar8 = ZEXT1224(ZEXT412(0x7830) << 0x40);
      LVar11.name.str._0_4_ = 0x1fdf9a;
      LVar11.super_LineCol.offset = auVar8._0_8_;
      LVar11.super_LineCol.line = auVar8._8_8_;
      LVar11.super_LineCol.col = auVar8._16_8_;
      LVar11.name.str._4_4_ = 0;
      LVar11.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_128,0x22,LVar11,(this->m_stack).m_callbacks.m_user_data);
    }
    this->m_state->node_id = sVar4;
    pTVar3 = this->m_tree;
    if ((sVar4 == 0xffffffffffffffff) || (pTVar3->m_cap <= sVar4)) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    NVar19 = (NodeType_e)((uint)pTVar3->m_buf[sVar4].m_type.type & 0x10);
    pTVar3 = this->m_tree;
    if ((sVar4 == 0xffffffffffffffff) || (pTVar3->m_cap <= sVar4)) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this_00 = this->m_tree;
    if ((pTVar3->m_buf[sVar4].m_type.type & MAP) == NOTYPE) {
      bVar12 = Tree::has_children(this_00,sVar4);
      if (bVar12) {
        if ((s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = '8';
        local_128[9] = 'x';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108._0_1_ = 'e';
        local_108._1_1_ = '\0';
        local_108._2_1_ = '\0';
        local_108._3_1_ = '\0';
        local_108._4_1_ = '\0';
        local_108._5_1_ = '\0';
        local_108._6_1_ = '\0';
        local_108._7_1_ = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: !m_tree->has_children(parent_id)",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      Tree::to_map(this->m_tree,sVar4,NVar19);
    }
    else {
      if ((sVar4 == 0xffffffffffffffff) || (this_00->m_cap <= sVar4)) {
        if ((s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = -0x7d;
        local_128[9] = 'K';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        pcStack_110 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_108._0_1_ = 'e';
        local_108._1_1_ = '\0';
        local_108._2_1_ = '\0';
        local_108._3_1_ = '\0';
        local_108._4_1_ = '\0';
        local_108._5_1_ = '\0';
        local_108._6_1_ = '\0';
        local_108._7_1_ = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar18 = this_00->m_buf;
      NVar19 = NVar19 | pNVar18[sVar4].m_type.type;
      Tree::_check_next_flags(this_00,sVar4,NVar19);
      pNVar18[sVar4].m_type.type = NVar19;
    }
    _move_scalar_from_top(this);
    if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
      this->m_key_anchor_was_before = true;
    }
    _write_val_anchor(this,sVar4);
    if ((1 < (this->m_stack).m_size) &&
       (((this->m_stack).m_stack[(this->m_stack).m_size - 2].flags & 0x800) != 0)) {
      this->m_state->flags = this->m_state->flags | 0x800;
    }
    pcVar16 = (this->m_state->line_contents).rem.str;
    pTVar3 = this->m_tree;
    if ((sVar4 == 0xffffffffffffffff) || (pTVar3->m_cap <= sVar4)) {
      if ((s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7d;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      pcStack_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_108._0_1_ = 'e';
      local_108._1_1_ = '\0';
      local_108._2_1_ = '\0';
      local_108._3_1_ = '\0';
      local_108._4_1_ = '\0';
      local_108._5_1_ = '\0';
      local_108._6_1_ = '\0';
      local_108._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pTVar3->m_buf[sVar4].m_val.scalar.str = pcVar16;
  }
  pcVar16 = (this->m_val_tag).str;
  if (pcVar16 != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar3 = this->m_tree;
    sVar4 = this->m_state->node_id;
    tag.len = (this->m_val_tag).len;
    tag.str = pcVar16;
    cVar21 = normalize_tag(tag);
    Tree::set_val_tag(pTVar3,sVar4,cVar21);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  return;
}

Assistant:

void Parser::_start_map(bool as_child)
{
    _c4dbgpf("start_map (as child={})", as_child);
    addrem_flags(RMAP|RVAL, RKEY|RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            type_bits key_quoted = NOTYPE;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_map(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_map: id={} key='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            m_tree->to_map(m_state->node_id);
            _c4dbgpf("start_map: id={}", m_state->node_id);
        }
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
        _write_val_anchor(m_state->node_id);
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
        m_state->node_id = parent_id;
        _c4dbgpf("start_map: id={}", m_state->node_id);
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_map(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_map(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        if(m_key_anchor.not_empty())
            m_key_anchor_was_before = true;
        _write_val_anchor(parent_id);
        if(m_stack.size() >= 2)
        {
            State const& parent_state = m_stack.top(1);
            if(parent_state.flags & RSET)
                add_flags(RSET);
        }
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}